

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O1

int Dtc_ManCutMergeOne(int *pCut0,int *pCut1,int *pCut)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int t;
  long lVar5;
  int t_2;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  if (-1 < *pCut1) {
    lVar5 = -1;
    do {
      pCut[lVar5 + 1] = pCut1[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (lVar5 < *pCut1);
  }
  if (0 < *pCut0) {
    lVar5 = 1;
    do {
      uVar6 = (ulong)*pCut1;
      bVar8 = (long)uVar6 < 1;
      if ((long)uVar6 < 1) {
LAB_00668d09:
        iVar2 = *pCut;
        if ((long)iVar2 == 3) {
          return 0;
        }
        iVar3 = pCut0[lVar5];
        *pCut = iVar2 + 1;
        pCut[(long)iVar2 + 1] = iVar3;
      }
      else {
        if (pCut0[lVar5] != pCut1[1]) {
          uVar7 = 0;
          do {
            if ((ulong)(*pCut1 + 1) - 2 == uVar7) goto LAB_00668d09;
            uVar1 = uVar7 + 1;
            lVar4 = uVar7 + 2;
            uVar7 = uVar1;
          } while (pCut0[lVar5] != pCut1[lVar4]);
          bVar8 = uVar6 <= uVar1;
        }
        if (bVar8) goto LAB_00668d09;
      }
      bVar8 = lVar5 < *pCut0;
      lVar5 = lVar5 + 1;
    } while (bVar8);
  }
  if ((*pCut & 0xfffffffeU) != 2) {
    __assert_fail("pCut[0] == 2 || pCut[0] == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                  ,0xcb,"int Dtc_ManCutMergeOne(int *, int *, int *)");
  }
  iVar2 = pCut[1];
  if (pCut[2] < iVar2) {
    pCut[1] = pCut[2];
    pCut[2] = iVar2;
  }
  iVar2 = pCut[1];
  iVar3 = pCut[2];
  if (iVar2 < iVar3) {
    if (*pCut != 2) {
      if (pCut[3] < iVar3) {
        pCut[2] = pCut[3];
        pCut[3] = iVar3;
      }
      if (pCut[2] < iVar2) {
        pCut[1] = pCut[2];
        pCut[2] = iVar2;
      }
      if (pCut[2] <= pCut[1]) {
        __assert_fail("pCut[1] < pCut[2]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                      ,0xd5,"int Dtc_ManCutMergeOne(int *, int *, int *)");
      }
      if (pCut[3] <= pCut[2]) {
        __assert_fail("pCut[2] < pCut[3]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                      ,0xd6,"int Dtc_ManCutMergeOne(int *, int *, int *)");
      }
    }
    return 1;
  }
  __assert_fail("pCut[1] < pCut[2]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                ,0xce,"int Dtc_ManCutMergeOne(int *, int *, int *)");
}

Assistant:

int Dtc_ManCutMergeOne( int * pCut0, int * pCut1, int * pCut )
{
    int i, k;
    for ( k = 0; k <= pCut1[0]; k++ )
        pCut[k] = pCut1[k];
    for ( i = 1; i <= pCut0[0]; i++ )
    {
        for ( k = 1; k <= pCut1[0]; k++ )
            if ( pCut0[i] == pCut1[k] )
                break;
        if ( k <= pCut1[0] )
            continue;
        if ( pCut[0] == 3 )
            return 0;
        pCut[1+pCut[0]++] = pCut0[i];
    }
    assert( pCut[0] == 2 || pCut[0] == 3 );
    if ( pCut[1] > pCut[2] )
        ABC_SWAP( int, pCut[1], pCut[2] );
    assert( pCut[1] < pCut[2] );
    if ( pCut[0] == 2 )
        return 1;
    if ( pCut[2] > pCut[3] )
        ABC_SWAP( int, pCut[2], pCut[3] );
    if ( pCut[1] > pCut[2] )
        ABC_SWAP( int, pCut[1], pCut[2] );
    assert( pCut[1] < pCut[2] );
    assert( pCut[2] < pCut[3] );
    return 1;
}